

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::
LoopTestOverS<signed_char,false,1u,true>(StorageAndSubImageTest *this,bool skip_rgb)

{
  bool bVar1;
  bool bVar2;
  undefined7 in_register_00000031;
  
  PrepareProgram(this,s_fragment_shader_1D_fdecl_lowp,s_fragment_shader_1D_tail);
  bVar1 = Test<signed_char,1,false,1u,true>(this);
  bVar2 = Test<signed_char,2,false,1u,true>(this);
  bVar2 = bVar2 && bVar1;
  if ((int)CONCAT71(in_register_00000031,skip_rgb) == 0) {
    bVar1 = Test<signed_char,3,false,1u,true>(this);
    bVar2 = bVar2 && bVar1;
  }
  bVar1 = Test<signed_char,4,false,1u,true>(this);
  CleanProgram(this);
  CleanErrors(this);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool StorageAndSubImageTest::LoopTestOverS(bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N, D>(), FragmentShaderTail<D>());

	/* Run tests. */
	bool result = true;

	result &= Test<T, 1, N, D, I>();

	result &= Test<T, 2, N, D, I>();

	if (!skip_rgb)
	{
		result &= Test<T, 3, N, D, I>();
	}

	result &= Test<T, 4, N, D, I>();

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}